

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O2

int uriPathTest(char *filename,char *result,char *err,int options)

{
  int iVar1;
  long lVar2;
  char *__format;
  
  iVar1 = xmlRegisterInputCallbacks(uripMatch,uripOpen,uripRead,uripClose);
  if (iVar1 < 0) {
    fwrite("failed to register HTTP handler\n",0x20,1,_stderr);
    iVar1 = -1;
  }
  else {
    iVar1 = 0;
    for (urip_current = 0; urip_current != 8; urip_current = urip_current + 1) {
      urip_success = '\0';
      lVar2 = xmlReadFile(urip_testURLs[urip_current],0,0);
      if (lVar2 == 0) {
        __format = "failed the parsing test for %s";
        if (urip_success != '\0') {
          __format = "failed the URL passing test for %s";
        }
LAB_0010869d:
        fprintf(_stderr,__format,urip_testURLs[urip_current]);
        iVar1 = iVar1 + 1;
      }
      else {
        xmlFreeDoc(lVar2);
        __format = "failed the URL passing test for %s";
        if (urip_success != '\0') goto LAB_0010869d;
      }
      nb_tests = nb_tests + 1;
    }
    xmlPopInputCallbacks();
  }
  return iVar1;
}

Assistant:

static int
uriPathTest(const char *filename ATTRIBUTE_UNUSED,
             const char *result ATTRIBUTE_UNUSED,
             const char *err ATTRIBUTE_UNUSED,
             int options ATTRIBUTE_UNUSED) {
    int parsed;
    int failures = 0;

    /*
     * register the new I/O handlers
     */
    if (xmlRegisterInputCallbacks(uripMatch, uripOpen, uripRead, uripClose) < 0)
    {
        fprintf(stderr, "failed to register HTTP handler\n");
	return(-1);
    }

    for (urip_current = 0;urip_testURLs[urip_current] != NULL;urip_current++) {
        urip_success = 1;
        parsed = urip_checkURL(urip_testURLs[urip_current]);
	if (urip_success != 1) {
	    fprintf(stderr, "failed the URL passing test for %s",
	            urip_testURLs[urip_current]);
	    failures++;
	} else if (parsed != 1) {
	    fprintf(stderr, "failed the parsing test for %s",
	            urip_testURLs[urip_current]);
	    failures++;
	}
	nb_tests++;
    }

    xmlPopInputCallbacks();
    return(failures);
}